

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void __thiscall IniProcessing::setValue(IniProcessing *this,char *key,short value)

{
  string local_40;
  short local_1a;
  char *pcStack_18;
  short value_local;
  char *key_local;
  IniProcessing *this_local;
  
  local_1a = value;
  pcStack_18 = key;
  key_local = (char *)this;
  std::__cxx11::to_string(&local_40,(int)value);
  writeIniParam(this,key,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void IniProcessing::setValue(const char *key, short value)
{
    writeIniParam(key, std::to_string(value));
}